

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keybdnu.c
# Opt level: O3

void al_clear_keyboard_state(ALLEGRO_DISPLAY *display)

{
  _Bool _Var1;
  ALLEGRO_EVENT_SOURCE *es;
  int keycode;
  uint uVar2;
  ALLEGRO_EVENT event;
  ALLEGRO_KEYBOARD_STATE ks;
  ALLEGRO_EVENT local_90;
  ALLEGRO_KEYBOARD_STATE local_48;
  
  if (display != (ALLEGRO_DISPLAY *)0x0) {
    es = &(*new_keyboard_driver->get_keyboard)()->es;
    (*new_keyboard_driver->get_keyboard_state)(&local_48);
    _al_event_source_lock(es);
    _Var1 = _al_event_source_needs_to_generate_event(es);
    if (_Var1) {
      uVar2 = 1;
      do {
        if ((local_48.__key_down__internal__[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
          local_90.type = 0xc;
          local_90.any.timestamp = al_get_time();
          local_90._36_8_ = 0;
          local_90.keyboard.display = display;
          local_90.display.width = uVar2;
          _al_event_source_emit_event(es,&local_90);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0xe3);
    }
    _al_event_source_unlock(es);
  }
  (*new_keyboard_driver->clear_keyboard_state)();
  return;
}

Assistant:

void al_clear_keyboard_state(ALLEGRO_DISPLAY *display)
{
   ASSERT(new_keyboard_driver);

   if (display) {
      ALLEGRO_EVENT_SOURCE *es = al_get_keyboard_event_source();
      ALLEGRO_KEYBOARD_STATE ks; al_get_keyboard_state(&ks);
      _al_event_source_lock(es);
      if (_al_event_source_needs_to_generate_event(es)) {
         int keycode;
         for (keycode = ALLEGRO_KEY_A; keycode < ALLEGRO_KEY_MAX; keycode++) {
            if (al_key_down(&ks, keycode)) {
               ALLEGRO_EVENT event;
               event.keyboard.type = ALLEGRO_EVENT_KEY_UP;
               event.keyboard.timestamp = al_get_time();
               event.keyboard.display = display;
               event.keyboard.keycode = keycode;
               event.keyboard.unichar = 0;
               event.keyboard.modifiers = 0;
               _al_event_source_emit_event(es, &event);
            }
         }
      }
      _al_event_source_unlock(es);
   }

   new_keyboard_driver->clear_keyboard_state();
}